

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarScrollingButtons(ImGuiTabBar *tab_bar)

{
  undefined8 uVar1;
  ImVec2 size;
  ImVec2 size_00;
  bool bVar2;
  int iVar3;
  ImGuiTabItem *pIVar4;
  ImVector<ImGuiTabItem> *in_RDI;
  float fVar5;
  int target_order;
  int selected_order;
  ImGuiTabItem *tab_item;
  ImGuiTabItem *tab_to_scroll_to;
  float x;
  float backup_repeat_rate;
  float backup_repeat_delay;
  ImVec4 arrow_col;
  int select_dir;
  ImVec2 backup_cursor_pos;
  float scrolling_buttons_width;
  ImVec2 arrow_button_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *in_stack_ffffffffffffff38;
  ImGuiTabBar *in_stack_ffffffffffffff40;
  int local_b4;
  ImVec4 *in_stack_ffffffffffffff58;
  ImVec4 *this;
  int local_a0;
  ImGuiCol in_stack_ffffffffffffff64;
  ImGuiTabItem *local_90;
  ImVec2 local_80 [2];
  ImVec2 local_6c;
  float local_64;
  undefined4 local_60;
  undefined4 local_5c;
  ImVec4 local_58;
  undefined8 local_48;
  undefined4 uStack_40;
  float fStack_3c;
  int local_34;
  undefined8 local_30;
  ImGuiButtonFlags in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  undefined4 local_18;
  float fVar6;
  float fVar7;
  undefined4 uStack_c;
  
  fVar7 = SUB84(GImGui,0);
  uStack_c = (undefined4)((ulong)GImGui >> 0x20);
  local_18 = SUB84(GImGui->CurrentWindow,0);
  fVar6 = (float)((ulong)GImGui->CurrentWindow >> 0x20);
  fVar5 = (GImGui->Style).FramePadding.y;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0,GImGui->FontSize + -2.0,
                 fVar5 + fVar5 + GImGui->FontSize);
  fVar5 = in_stack_ffffffffffffffe0 + in_stack_ffffffffffffffe0;
  local_30 = *(undefined8 *)(CONCAT44(fVar6,local_18) + 0xe0);
  local_34 = 0;
  local_48 = *(undefined8 *)(CONCAT44(uStack_c,fVar7) + 0x38a8);
  uVar1 = *(undefined8 *)(CONCAT44(uStack_c,fVar7) + 0x38b0);
  fStack_3c = (float)((ulong)uVar1 >> 0x20);
  _uStack_40 = CONCAT44(fStack_3c * 0.5,(int)uVar1);
  PushStyleColor(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
  this = &local_58;
  ImVec4::ImVec4(this,0.0,0.0,0.0,0.0);
  PushStyleColor(in_stack_ffffffffffffff64,this);
  local_5c = *(undefined4 *)(CONCAT44(uStack_c,fVar7) + 0x3c);
  local_60 = *(undefined4 *)(CONCAT44(uStack_c,fVar7) + 0x40);
  *(undefined4 *)(CONCAT44(uStack_c,fVar7) + 0x3c) = 0x3e800000;
  *(undefined4 *)(CONCAT44(uStack_c,fVar7) + 0x40) = 0x3e4ccccd;
  local_64 = ImMax<float>(*(float *)((long)&in_RDI[2].Data + 4),(float)in_RDI[3].Capacity - fVar5);
  ImVec2::ImVec2(&local_6c,local_64,(float)in_RDI[3].Size);
  *(ImVec2 *)(CONCAT44(fVar6,local_18) + 0xe0) = local_6c;
  size.y = fVar7;
  size.x = fVar6;
  bVar2 = ArrowButtonEx((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (ImGuiDir)fVar5,size,in_stack_ffffffffffffffd8);
  if (bVar2) {
    local_34 = -1;
  }
  ImVec2::ImVec2(local_80,local_64 + in_stack_ffffffffffffffe0,(float)in_RDI[3].Size);
  *(ImVec2 *)(CONCAT44(fVar6,local_18) + 0xe0) = local_80[0];
  size_00.y = fVar7;
  size_00.x = fVar6;
  bVar2 = ArrowButtonEx((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (ImGuiDir)fVar5,size_00,in_stack_ffffffffffffffd8);
  if (bVar2) {
    local_34 = 1;
  }
  PopStyleColor((int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  *(undefined4 *)(CONCAT44(uStack_c,fVar7) + 0x40) = local_60;
  *(undefined4 *)(CONCAT44(uStack_c,fVar7) + 0x3c) = local_5c;
  local_90 = (ImGuiTabItem *)0x0;
  if ((local_34 != 0) &&
     (pIVar4 = TabBarFindTabByID(in_stack_ffffffffffffff38,0), pIVar4 != (ImGuiTabItem *)0x0)) {
    iVar3 = ImGuiTabBar::GetTabOrder
                      (in_stack_ffffffffffffff40,(ImGuiTabItem *)in_stack_ffffffffffffff38);
    local_a0 = iVar3 + local_34;
    while (local_90 == (ImGuiTabItem *)0x0) {
      local_b4 = iVar3;
      if ((-1 < local_a0) && (local_a0 < in_RDI->Size)) {
        local_b4 = local_a0;
      }
      local_90 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_b4);
      if ((local_90->Flags & 0x200000U) != 0) {
        local_a0 = local_34 + local_a0;
        iVar3 = local_34 + iVar3;
        if ((-1 < local_a0) && (local_a0 < in_RDI->Size)) {
          local_90 = (ImGuiTabItem *)0x0;
        }
      }
    }
  }
  *(undefined8 *)(CONCAT44(fVar6,local_18) + 0xe0) = local_30;
  in_RDI[3].Capacity = (int)((float)in_RDI[3].Capacity - (fVar5 + 1.0));
  return local_90;
}

Assistant:

static ImGuiTabItem* ImGui::TabBarScrollingButtons(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImVec2 arrow_button_size(g.FontSize - 2.0f, g.FontSize + g.Style.FramePadding.y * 2.0f);
    const float scrolling_buttons_width = arrow_button_size.x * 2.0f;

    const ImVec2 backup_cursor_pos = window->DC.CursorPos;
    //window->DrawList->AddRect(ImVec2(tab_bar->BarRect.Max.x - scrolling_buttons_width, tab_bar->BarRect.Min.y), ImVec2(tab_bar->BarRect.Max.x, tab_bar->BarRect.Max.y), IM_COL32(255,0,0,255));

    int select_dir = 0;
    ImVec4 arrow_col = g.Style.Colors[ImGuiCol_Text];
    arrow_col.w *= 0.5f;

    PushStyleColor(ImGuiCol_Text, arrow_col);
    PushStyleColor(ImGuiCol_Button, ImVec4(0, 0, 0, 0));
    const float backup_repeat_delay = g.IO.KeyRepeatDelay;
    const float backup_repeat_rate = g.IO.KeyRepeatRate;
    g.IO.KeyRepeatDelay = 0.250f;
    g.IO.KeyRepeatRate = 0.200f;
    float x = ImMax(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.x - scrolling_buttons_width);
    window->DC.CursorPos = ImVec2(x, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##<", ImGuiDir_Left, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = -1;
    window->DC.CursorPos = ImVec2(x + arrow_button_size.x, tab_bar->BarRect.Min.y);
    if (ArrowButtonEx("##>", ImGuiDir_Right, arrow_button_size, ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_Repeat))
        select_dir = +1;
    PopStyleColor(2);
    g.IO.KeyRepeatRate = backup_repeat_rate;
    g.IO.KeyRepeatDelay = backup_repeat_delay;

    ImGuiTabItem* tab_to_scroll_to = NULL;
    if (select_dir != 0)
        if (ImGuiTabItem* tab_item = TabBarFindTabByID(tab_bar, tab_bar->SelectedTabId))
        {
            int selected_order = tab_bar->GetTabOrder(tab_item);
            int target_order = selected_order + select_dir;

            // Skip tab item buttons until another tab item is found or end is reached
            while (tab_to_scroll_to == NULL)
            {
                // If we are at the end of the list, still scroll to make our tab visible
                tab_to_scroll_to = &tab_bar->Tabs[(target_order >= 0 && target_order < tab_bar->Tabs.Size) ? target_order : selected_order];

                // Cross through buttons
                // (even if first/last item is a button, return it so we can update the scroll)
                if (tab_to_scroll_to->Flags & ImGuiTabItemFlags_Button)
                {
                    target_order += select_dir;
                    selected_order += select_dir;
                    tab_to_scroll_to = (target_order < 0 || target_order >= tab_bar->Tabs.Size) ? tab_to_scroll_to : NULL;
                }
            }
        }
    window->DC.CursorPos = backup_cursor_pos;
    tab_bar->BarRect.Max.x -= scrolling_buttons_width + 1.0f;

    return tab_to_scroll_to;
}